

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

bool __thiscall
basisu::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  uint64_t *puVar1;
  vector<unsigned_char> *this_00;
  uint32_t uVar2;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar3;
  params *ppVar4;
  uint *puVar5;
  color_rgba *pSrc_pixels;
  uchar *puVar6;
  byte bVar7;
  byte bVar8;
  potential_solution *ppVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong __n;
  ushort uVar24;
  uint uVar25;
  uint uVar27;
  int iVar28;
  uint uVar29;
  undefined1 auVar26 [16];
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  undefined1 in_XMM6 [16];
  color_rgba block_colors [4];
  uint32_t block_inten_midpoints [3];
  int64_t block_error;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_b8;
  uint uStack_b4;
  uint uStack_b0;
  undefined4 uStack_ac;
  uint64_t *local_a0;
  undefined4 local_98;
  uint local_94 [3];
  etc1_solution_coordinates *local_88;
  potential_solution *local_80;
  ulong local_78;
  ulong local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar10 = check_for_redundant_solution(this,coords);
  if (!bVar10) {
    return false;
  }
  ppVar4 = this->m_pParams;
  bVar15 = (coords->m_unscaled_color).field_0.m_comps[0];
  if (ppVar4->m_constrain_against_base_color5 == true) {
    iVar18 = (uint)bVar15 - (uint)(ppVar4->m_base_color5).field_0.m_comps[0];
    iVar16 = (uint)(coords->m_unscaled_color).field_0.m_comps[1] -
             (uint)(ppVar4->m_base_color5).field_0.m_comps[1];
    iVar20 = (uint)(coords->m_unscaled_color).field_0.m_comps[2] -
             (uint)(ppVar4->m_base_color5).field_0.m_comps[2];
    iVar28 = iVar16;
    if (iVar18 < iVar16) {
      iVar28 = iVar18;
    }
    if (iVar20 <= iVar28) {
      iVar28 = iVar20;
    }
    if (-5 < iVar28) {
      if (iVar16 < iVar18) {
        iVar16 = iVar18;
      }
      if (iVar16 <= iVar20) {
        iVar16 = iVar20;
      }
      if (iVar16 < 4) goto LAB_0022706d;
    }
    trial_solution->m_valid = false;
  }
  else {
LAB_0022706d:
    local_80 = pBest_solution;
    if (coords->m_color4 == true) {
      bVar15 = bVar15 << 4 | bVar15;
      uVar24 = *(ushort *)((long)&(coords->m_unscaled_color).field_0 + 1);
      auVar26 = psllw(ZEXT216(uVar24),4);
      uVar24 = auVar26._0_2_ & (ushort)DAT_002775c0 | uVar24;
    }
    else {
      bVar15 = bVar15 << 3 | bVar15 >> 2;
      uVar24 = *(ushort *)((long)&(coords->m_unscaled_color).field_0 + 1);
      auVar26 = psllw(ZEXT216(uVar24),3);
      uVar24 = auVar26._0_2_ & (ushort)DAT_00277580 | uVar24 >> 2 & (ushort)DAT_00277590;
    }
    uVar19 = ppVar4->m_num_src_pixels;
    __n = (ulong)uVar19;
    if ((trial_solution->m_selectors).m_size != uVar19) {
      __assert_fail("trial_solution.m_selectors.size() == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                    ,0x519,
                    "bool basisu::etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates &, potential_solution &, potential_solution *)"
                   );
    }
    bVar7 = (byte)(uVar24 >> 8);
    bVar8 = (byte)uVar24;
    trial_solution->m_error = 0xffffffffffffffff;
    ppVar4 = this->m_pParams;
    local_88 = coords;
    if ((ppVar4->super_basis_etc1_pack_params).m_quality == cETCQualityFast) {
      local_98 = 0;
    }
    else {
      local_98 = (int)CONCAT71((int7)((ulong)ppVar4 >> 8),
                               (ppVar4->super_basis_etc1_pack_params).m_perceptual);
    }
    local_a0 = &trial_solution->m_error;
    local_78 = (ulong)(uVar19 - 1);
    local_48._1_3_ = 0;
    local_48[0] = bVar15;
    local_48[4] = bVar15;
    local_48._5_3_ = 0;
    local_48[8] = bVar15;
    local_48._9_3_ = 0;
    local_48[0xc] = bVar15;
    local_48._13_3_ = 0;
    local_58._1_3_ = 0;
    local_58[0] = bVar8;
    local_58[4] = bVar8;
    local_58._5_3_ = 0;
    local_58[8] = bVar8;
    local_58._9_3_ = 0;
    local_58[0xc] = bVar8;
    local_58._13_3_ = 0;
    local_68._1_3_ = 0;
    local_68[0] = bVar7;
    local_68[4] = bVar7;
    local_68._5_3_ = 0;
    local_68[8] = bVar7;
    local_68._9_3_ = 0;
    local_68[0xc] = bVar7;
    local_68._13_3_ = 0;
    lVar23 = 7;
    do {
      lVar13 = lVar23 * 0x10;
      iVar28 = *(int *)(g_etc1_inten_tables + lVar13);
      iVar16 = *(int *)(g_etc1_inten_tables + lVar13 + 4);
      iVar18 = *(int *)(g_etc1_inten_tables + lVar13 + 8);
      iVar20 = *(int *)(g_etc1_inten_tables + lVar13 + 0xc);
      uVar25 = iVar28 + local_48._0_4_;
      uVar27 = iVar16 + local_48._4_4_;
      uVar29 = iVar18 + local_48._8_4_;
      uVar30 = iVar20 + local_48._12_4_;
      uVar37 = iVar28 + local_58._0_4_;
      uVar38 = iVar16 + local_58._4_4_;
      uVar39 = iVar18 + local_58._8_4_;
      uVar40 = iVar20 + local_58._12_4_;
      uVar32 = iVar28 + local_68._0_4_;
      uVar33 = iVar16 + local_68._4_4_;
      uVar35 = iVar18 + local_68._8_4_;
      uVar36 = iVar20 + local_68._12_4_;
      in_XMM6 = pmovzxbd(in_XMM6,0xffffffff);
      uVar12 = in_XMM6._0_4_;
      uVar11 = in_XMM6._4_4_;
      uVar17 = in_XMM6._8_4_;
      uVar31 = in_XMM6._12_4_;
      uVar32 = ~((int)uVar32 >> 0x1f) & ((uVar12 < uVar32) * uVar12 | (uVar12 >= uVar32) * uVar32);
      uVar34 = ~((int)uVar33 >> 0x1f) & ((uVar11 < uVar33) * uVar11 | (uVar11 >= uVar33) * uVar33);
      uVar35 = ~((int)uVar35 >> 0x1f) & ((uVar17 < uVar35) * uVar17 | (uVar17 >= uVar35) * uVar35);
      uVar33 = ~((int)uVar36 >> 0x1f) & ((uVar31 < uVar36) * uVar31 | (uVar31 >= uVar36) * uVar36);
      uVar36 = ~((int)uVar37 >> 0x1f) & ((uVar12 < uVar37) * uVar12 | (uVar12 >= uVar37) * uVar37);
      uVar37 = ~((int)uVar38 >> 0x1f) & ((uVar11 < uVar38) * uVar11 | (uVar11 >= uVar38) * uVar38);
      uVar38 = ~((int)uVar39 >> 0x1f) & ((uVar17 < uVar39) * uVar17 | (uVar17 >= uVar39) * uVar39);
      uVar39 = ~((int)uVar40 >> 0x1f) & ((uVar31 < uVar40) * uVar31 | (uVar31 >= uVar40) * uVar40);
      uVar12 = ~((int)uVar25 >> 0x1f) & ((uVar12 < uVar25) * uVar12 | (uVar12 >= uVar25) * uVar25);
      uVar25 = ~((int)uVar27 >> 0x1f) & ((uVar11 < uVar27) * uVar11 | (uVar11 >= uVar27) * uVar27);
      uVar17 = ~((int)uVar29 >> 0x1f) & ((uVar17 < uVar29) * uVar17 | (uVar17 >= uVar29) * uVar29);
      uVar31 = ~((int)uVar30 >> 0x1f) & ((uVar31 < uVar30) * uVar31 | (uVar31 >= uVar30) * uVar30);
      uVar27 = uVar39 << 8 | uVar33 << 0x10 | uVar31;
      local_b8 = (anon_union_4_2_6eba8969_for_color_rgba_0)
                 (uVar36 << 8 | uVar32 << 0x10 | uVar12 | 0xff000000);
      uStack_b4 = uVar37 << 8 | uVar34 << 0x10 | uVar25 | 0xff000000;
      uStack_b0 = uVar38 << 8 | uVar35 << 0x10 | uVar17 | 0xff000000;
      uStack_ac = uVar27 | 0xff000000;
      uVar11 = uStack_ac;
      uVar32 = uVar12 + uVar36 + uVar32;
      iVar28 = uVar25 + uVar37 + uVar34;
      iVar16 = uVar17 + uVar38 + uVar35;
      uVar33 = uVar31 + uVar39 + uVar33;
      local_94[0] = iVar28 + uVar32;
      local_94[1] = iVar28 + iVar16;
      local_94[2] = iVar16 + uVar33;
      puVar5 = this->m_pSorted_luma;
      pSrc_pixels = this->m_pParams->m_pSrc_pixels;
      uVar12 = puVar5[local_78];
      uStack_ac._1_1_ = (byte)(uVar27 >> 8);
      uStack_ac._2_1_ = (byte)(uVar27 >> 0x10);
      uStack_ac = uVar11;
      if ((char)local_98 == '\0') {
        if (local_94[0] <= uVar12 * 2) {
          uVar12 = *puVar5;
          if (uVar12 * 2 < local_94[2]) {
            if (__n == 0) {
              uVar14 = 0;
              uVar12 = 0;
LAB_002277ed:
              if (uVar12 < uVar19) {
                uVar21 = (ulong)uVar12;
                do {
                  uVar12 = this->m_pSorted_luma_indices[uVar21];
                  if ((this->m_temp_selectors).m_size <= uVar12) goto LAB_00227a68;
                  (this->m_temp_selectors).m_p[uVar12] = '\x03';
                  iVar28 = (uVar31 & 0xff) - (uint)pSrc_pixels[uVar12].field_0.m_comps[0];
                  iVar16 = (uint)uStack_ac._1_1_ - (uint)pSrc_pixels[uVar12].field_0.m_comps[1];
                  iVar18 = (uint)uStack_ac._2_1_ - (uint)pSrc_pixels[uVar12].field_0.m_comps[2];
                  uVar14 = uVar14 + (uint)(iVar18 * iVar18 + iVar16 * iVar16 + iVar28 * iVar28);
                  uVar21 = uVar21 + 1;
                } while (uVar19 != (uint)uVar21);
              }
            }
            else {
              uVar12 = 0;
              uVar21 = 0;
              uVar14 = 0;
              do {
                while (local_94[uVar21] <= this->m_pSorted_luma[uVar12] * 2) {
                  uVar17 = (int)uVar21 + 1;
                  uVar21 = (ulong)uVar17;
                  if (2 < uVar17) goto LAB_002277ed;
                }
                uVar17 = this->m_pSorted_luma_indices[uVar12];
                if ((this->m_temp_selectors).m_size <= uVar17) goto LAB_00227a68;
                (this->m_temp_selectors).m_p[uVar17] = (uchar)uVar21;
                iVar16 = (uint)local_b8.m_comps[uVar21 * 4] -
                         (uint)pSrc_pixels[uVar17].field_0.m_comps[0];
                iVar18 = (uint)local_b8.m_comps[uVar21 * 4 + 1] -
                         (uint)pSrc_pixels[uVar17].field_0.m_comps[1];
                iVar28 = (uint)local_b8.m_comps[uVar21 * 4 + 2] -
                         (uint)pSrc_pixels[uVar17].field_0.m_comps[2];
                uVar14 = uVar14 + (uint)(iVar28 * iVar28 + iVar18 * iVar18 + iVar16 * iVar16);
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar19);
            }
          }
          else {
            uVar11 = uVar12 - uVar33;
            if (uVar33 <= uVar12 && uVar11 != 0) {
              uVar12 = -uVar11;
              if (0 < (int)uVar11) {
                uVar12 = uVar11;
              }
              if (*local_a0 <= (ulong)uVar12) goto LAB_0022797d;
            }
            if ((this->m_temp_selectors).m_size == 0) goto LAB_00227a68;
            memset((this->m_temp_selectors).m_p,3,__n);
            if (__n == 0) goto LAB_0022768a;
            uVar21 = 0;
            uVar14 = 0;
            do {
              iVar28 = (uStack_ac & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[0];
              iVar16 = (uStack_ac >> 8 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[1];
              iVar18 = (uStack_ac >> 0x10 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[2];
              uVar14 = uVar14 + (uint)(iVar18 * iVar18 + iVar16 * iVar16 + iVar28 * iVar28);
              uVar21 = uVar21 + 1;
              uVar11 = uStack_ac;
            } while (__n != uVar21);
          }
          goto LAB_0022791f;
        }
        uVar11 = uVar32 - uVar12;
        if (uVar12 <= uVar32 && uVar11 != 0) {
          uVar12 = -uVar11;
          if (0 < (int)uVar11) {
            uVar12 = uVar11;
          }
          if (*local_a0 <= (ulong)uVar12) goto LAB_0022797d;
        }
        if ((this->m_temp_selectors).m_size == 0) goto LAB_00227a68;
        memset((this->m_temp_selectors).m_p,0,__n);
        if (__n != 0) {
          uVar21 = 0;
          uVar14 = 0;
          do {
            iVar28 = ((uint)local_b8 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[0];
            iVar16 = ((uint)local_b8 >> 8 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[1];
            iVar18 = ((uint)local_b8 >> 0x10 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[2];
            uVar14 = uVar14 + (uint)(iVar18 * iVar18 + iVar16 * iVar16 + iVar28 * iVar28);
            uVar21 = uVar21 + 1;
            uVar11 = uStack_ac;
          } while (__n != uVar21);
          goto LAB_0022791f;
        }
LAB_0022768a:
        uVar14 = 0;
        uVar11 = uStack_ac;
LAB_0022791f:
        uStack_ac = uVar11;
        if (uVar14 < *local_a0) {
          trial_solution->m_error = uVar14;
          (trial_solution->m_coords).m_inten_table = (uint32_t)lVar23;
          puVar6 = (trial_solution->m_selectors).m_p;
          (trial_solution->m_selectors).m_p = (this->m_temp_selectors).m_p;
          (this->m_temp_selectors).m_p = puVar6;
          uVar2 = (trial_solution->m_selectors).m_size;
          (trial_solution->m_selectors).m_size = (this->m_temp_selectors).m_size;
          (this->m_temp_selectors).m_size = uVar2;
          uVar2 = (trial_solution->m_selectors).m_capacity;
          (trial_solution->m_selectors).m_capacity = (this->m_temp_selectors).m_capacity;
          (this->m_temp_selectors).m_capacity = uVar2;
          trial_solution->m_valid = true;
          if (uVar14 == 0) break;
        }
      }
      else {
        if (local_94[0] <= uVar12 * 2) {
          uVar12 = *puVar5;
          if (uVar12 * 2 < local_94[2]) {
            if (g_cpu_supports_sse41 == '\0') {
              if (__n == 0) {
                uVar12 = 0;
                uVar14 = 0;
LAB_00227864:
                if (uVar12 < uVar19) {
                  uVar21 = (ulong)uVar12;
                  do {
                    uVar12 = this->m_pSorted_luma_indices[uVar21];
                    if ((this->m_temp_selectors).m_size <= uVar12) goto LAB_00227a68;
                    (this->m_temp_selectors).m_p[uVar12] = '\x03';
                    iVar28 = (uVar31 & 0xff) - (uint)pSrc_pixels[uVar12].field_0.m_comps[0];
                    iVar16 = (uint)uStack_ac._2_1_ - (uint)pSrc_pixels[uVar12].field_0.m_comps[2];
                    iVar18 = iVar16 * 9 + iVar28 * 0x1b +
                             ((uint)uStack_ac._1_1_ - (uint)pSrc_pixels[uVar12].field_0.m_comps[1])
                             * 0x5c;
                    lVar13 = (long)(iVar28 * 0x80 - iVar18);
                    lVar22 = (long)(iVar16 * 0x80 - iVar18);
                    uVar14 = uVar14 + (((uint)((int)((ulong)(lVar22 * lVar22) >> 7) * 3) >> 7) +
                                       (int)((ulong)((long)iVar18 * (long)iVar18) >> 7) +
                                      ((uint)((int)((ulong)(lVar13 * lVar13) >> 7) * 0x1a) >> 7));
                    uVar21 = uVar21 + 1;
                  } while (uVar19 != (uint)uVar21);
                }
              }
              else {
                uVar14 = 0;
                uVar21 = 0;
                uVar12 = 0;
                do {
                  while (local_94[uVar21] <= this->m_pSorted_luma[uVar12] * 2) {
                    uVar17 = (int)uVar21 + 1;
                    uVar21 = (ulong)uVar17;
                    if (2 < uVar17) goto LAB_00227864;
                  }
                  uVar17 = this->m_pSorted_luma_indices[uVar12];
                  if ((this->m_temp_selectors).m_size <= uVar17) goto LAB_00227a68;
                  (this->m_temp_selectors).m_p[uVar17] = (uchar)uVar21;
                  iVar28 = (uint)local_b8.m_comps[uVar21 * 4] -
                           (uint)pSrc_pixels[uVar17].field_0.m_comps[0];
                  iVar18 = (uint)local_b8.m_comps[uVar21 * 4 + 2] -
                           (uint)pSrc_pixels[uVar17].field_0.m_comps[2];
                  iVar16 = iVar18 * 9 + iVar28 * 0x1b +
                           ((uint)local_b8.m_comps[uVar21 * 4 + 1] -
                           (uint)pSrc_pixels[uVar17].field_0.m_comps[1]) * 0x5c;
                  lVar13 = (long)(iVar28 * 0x80 - iVar16);
                  lVar22 = (long)(iVar18 * 0x80 - iVar16);
                  uVar14 = uVar14 + (((uint)((int)((ulong)(lVar22 * lVar22) >> 7) * 3) >> 7) +
                                     (int)((ulong)((long)iVar16 * (long)iVar16) >> 7) +
                                    ((uint)((int)((ulong)(lVar13 * lVar13) >> 7) * 0x1a) >> 7));
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar19);
              }
            }
            else {
              uVar12 = 0;
              if (__n == 0) {
LAB_0022777f:
                if (uVar12 < uVar19) {
                  uVar14 = (ulong)uVar12;
                  do {
                    if ((this->m_temp_selectors).m_size <= this->m_pSorted_luma_indices[uVar14])
                    goto LAB_00227a68;
                    (this->m_temp_selectors).m_p[this->m_pSorted_luma_indices[uVar14]] = '\x03';
                    uVar14 = uVar14 + 1;
                  } while (uVar19 != (uint)uVar14);
                }
              }
              else {
                uVar11 = 0;
                do {
                  while (local_94[uVar11] <= this->m_pSorted_luma[uVar12] * 2) {
                    uVar11 = uVar11 + 1;
                    if (2 < uVar11) goto LAB_0022777f;
                  }
                  if ((this->m_temp_selectors).m_size <= this->m_pSorted_luma_indices[uVar12])
                  goto LAB_00227a68;
                  (this->m_temp_selectors).m_p[this->m_pSorted_luma_indices[uVar12]] = (uchar)uVar11
                  ;
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar19);
              }
              if ((this->m_temp_selectors).m_size == 0) goto LAB_00227a68;
              perceptual_distance_rgb_4_N_sse41
                        ((int64_t *)&local_70,(this->m_temp_selectors).m_p,
                         (color_rgba *)&local_b8.field_1,pSrc_pixels,uVar19,0x7fffffffffffffff);
              uVar14 = local_70;
              uVar11 = uStack_ac;
            }
          }
          else {
            uVar11 = uVar12 - uVar33;
            if (uVar33 <= uVar12 && uVar11 != 0) {
              uVar12 = -uVar11;
              if (0 < (int)uVar11) {
                uVar12 = uVar11;
              }
              if (*local_a0 <= (ulong)uVar12) goto LAB_0022797d;
            }
            if ((this->m_temp_selectors).m_size == 0) goto LAB_00227a68;
            memset((this->m_temp_selectors).m_p,3,__n);
            if (__n == 0) goto LAB_0022768a;
            uVar21 = 0;
            uVar14 = 0;
            do {
              iVar16 = (uStack_ac & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[0];
              iVar18 = (uStack_ac >> 0x10 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[2];
              iVar28 = iVar18 * 9 + iVar16 * 0x1b +
                       ((uStack_ac >> 8 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[1]) *
                       0x5c;
              lVar13 = (long)(iVar16 * 0x80 - iVar28);
              lVar22 = (long)(iVar18 * 0x80 - iVar28);
              uVar14 = uVar14 + (((uint)((int)((ulong)(lVar22 * lVar22) >> 7) * 3) >> 7) +
                                 (int)((ulong)((long)iVar28 * (long)iVar28) >> 7) +
                                ((uint)((int)((ulong)(lVar13 * lVar13) >> 7) * 0x1a) >> 7));
              uVar21 = uVar21 + 1;
              uVar11 = uStack_ac;
            } while (__n != uVar21);
          }
          goto LAB_0022791f;
        }
        uVar11 = uVar32 - uVar12;
        if (uVar32 < uVar12 || uVar11 == 0) {
LAB_0022726b:
          if ((this->m_temp_selectors).m_size == 0) {
LAB_00227a68:
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,
                          "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]"
                         );
          }
          memset((this->m_temp_selectors).m_p,0,__n);
          if (__n == 0) goto LAB_0022768a;
          uVar21 = 0;
          uVar14 = 0;
          do {
            iVar16 = ((uint)local_b8 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[0];
            iVar18 = ((uint)local_b8 >> 0x10 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[2];
            iVar28 = iVar18 * 9 + iVar16 * 0x1b +
                     (((uint)local_b8 >> 8 & 0xff) - (uint)pSrc_pixels[uVar21].field_0.m_comps[1]) *
                     0x5c;
            lVar13 = (long)(iVar16 * 0x80 - iVar28);
            lVar22 = (long)(iVar18 * 0x80 - iVar28);
            uVar14 = uVar14 + (((uint)((int)((ulong)(lVar22 * lVar22) >> 7) * 3) >> 7) +
                               (int)((ulong)((long)iVar28 * (long)iVar28) >> 7) +
                              ((uint)((int)((ulong)(lVar13 * lVar13) >> 7) * 0x1a) >> 7));
            uVar21 = uVar21 + 1;
            uVar11 = uStack_ac;
          } while (__n != uVar21);
          goto LAB_0022791f;
        }
        uVar12 = -uVar11;
        if (0 < (int)uVar11) {
          uVar12 = uVar11;
        }
        if ((ulong)uVar12 < *local_a0) goto LAB_0022726b;
      }
LAB_0022797d:
      bVar10 = lVar23 != 0;
      lVar23 = lVar23 + -1;
    } while (bVar10);
    ppVar9 = local_80;
    aVar3 = (local_88->m_unscaled_color).field_0;
    (trial_solution->m_coords).m_unscaled_color.field_0 = aVar3;
    (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
    if ((local_80 != (potential_solution *)0x0) && (*local_a0 < local_80->m_error)) {
      puVar1 = &local_80->m_error;
      (local_80->m_coords).m_unscaled_color.field_0 = aVar3;
      (local_80->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
      (local_80->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
      if (local_80 != trial_solution) {
        this_00 = &local_80->m_selectors;
        uVar19 = (trial_solution->m_selectors).m_size;
        if ((local_80->m_selectors).m_capacity < uVar19) {
          if (this_00->m_p != (uchar *)0x0) {
            free(this_00->m_p);
            this_00->m_p = (uchar *)0x0;
            this_00->m_size = 0;
            this_00->m_capacity = 0;
            uVar19 = (trial_solution->m_selectors).m_size;
          }
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar19,false,1,(object_mover)0x0,false);
        }
        else if ((local_80->m_selectors).m_size != 0) {
          (local_80->m_selectors).m_size = 0;
        }
        if ((this_00->m_p != (uchar *)0x0) &&
           (puVar6 = (trial_solution->m_selectors).m_p, puVar6 != (uchar *)0x0)) {
          memcpy(this_00->m_p,puVar6,(ulong)(trial_solution->m_selectors).m_size);
        }
        (ppVar9->m_selectors).m_size = (trial_solution->m_selectors).m_size;
      }
      ppVar9->m_valid = *(bool *)(local_a0 + 1);
      *puVar1 = *local_a0;
      return true;
    }
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution)
	{
		if (!check_for_redundant_solution(coords))
			return false;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
		printf("Eval solution fast: %u %u %u\n", coords.m_unscaled_color.r, coords.m_unscaled_color.g, coords.m_unscaled_color.b);
#endif

		if (m_pParams->m_constrain_against_base_color5)
		{
			const int dr = (int)coords.m_unscaled_color.r - (int)m_pParams->m_base_color5.r;
			const int dg = (int)coords.m_unscaled_color.g - (int)m_pParams->m_base_color5.g;
			const int db = (int)coords.m_unscaled_color.b - (int)m_pParams->m_base_color5.b;

			if ((minimum(dr, dg, db) < cETC1ColorDeltaMin) || (maximum(dr, dg, db) > cETC1ColorDeltaMax))
			{
				trial_solution.m_valid = false;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
				printf("Eval failed due to constraint from %u %u %u\n", m_pParams->m_base_color5.r, m_pParams->m_base_color5.g, m_pParams->m_base_color5.b);
#endif
				return false;
			}
		}

		const color_rgba base_color(coords.get_scaled_color());
		
		const uint32_t n = m_pParams->m_num_src_pixels;
		assert(trial_solution.m_selectors.size() == n);

		trial_solution.m_error = UINT64_MAX;
								
		const bool perceptual = (m_pParams->m_quality == cETCQualityFast) ? false : m_pParams->m_perceptual;
				
		for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table)
		{
			const int* pInten_table = g_etc1_inten_tables[inten_table];

			uint32_t block_inten[4];
			color_rgba block_colors[4];
			for (uint32_t s = 0; s < 4; s++)
			{
				const int yd = pInten_table[s];
				color_rgba block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 255);
				block_colors[s] = block_color;
				block_inten[s] = block_color.r + block_color.g + block_color.b;
			}

			// evaluate_solution_fast() enforces/assumes a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
			// The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
			// 0   1   2   3
			//   01  12  23
			const uint32_t block_inten_midpoints[3] = { block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3] };
															
			uint64_t total_error = 0;
			const color_rgba* pSrc_pixels = m_pParams->m_pSrc_pixels;
						
			if (perceptual)
			{
				if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
				{
					if (block_inten[0] > m_pSorted_luma[n - 1])
					{
						const uint32_t min_error = iabs((int)block_inten[0] - (int)m_pSorted_luma[n - 1]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 0, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(true, block_colors[0], pSrc_pixels[c], false);
				}
				else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
				{
					if (m_pSorted_luma[0] > block_inten[3])
					{
						const uint32_t min_error = iabs((int)m_pSorted_luma[0] - (int)block_inten[3]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 3, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(true, block_colors[3], pSrc_pixels[c], false);
				}
				else
				{
					if (!g_cpu_supports_sse41)
					{
						uint32_t cur_selector = 0, c;
						for (c = 0; c < n; c++)
						{
							const uint32_t y = m_pSorted_luma[c];
							while ((y * 2) >= block_inten_midpoints[cur_selector])
								if (++cur_selector > 2)
									goto done;
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
							total_error += color_distance(true, block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
						}
					done:
						while (c < n)
						{
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = 3;
							total_error += color_distance(true, block_colors[3], pSrc_pixels[sorted_pixel_index], false);
							++c;
						}
					}
					else
					{
#if BASISU_SUPPORT_SSE
						uint32_t cur_selector = 0, c;

						for (c = 0; c < n; c++)
						{
							const uint32_t y = m_pSorted_luma[c];
							while ((y * 2) >= block_inten_midpoints[cur_selector])
							{
								if (++cur_selector > 2)
									goto done3;
							}
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
						}
					done3:

						while (c < n)
						{
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = 3;
							++c;
						}

						int64_t block_error;
						perceptual_distance_rgb_4_N_sse41(&block_error, &m_temp_selectors[0], block_colors, pSrc_pixels, n, INT64_MAX);
						total_error += block_error;
#endif
					}
				}
			}
			else
			{
				if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
				{
					if (block_inten[0] > m_pSorted_luma[n - 1])
					{
						const uint32_t min_error = iabs((int)block_inten[0] - (int)m_pSorted_luma[n - 1]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 0, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(block_colors[0], pSrc_pixels[c], false);
				}
				else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
				{
					if (m_pSorted_luma[0] > block_inten[3])
					{
						const uint32_t min_error = iabs((int)m_pSorted_luma[0] - (int)block_inten[3]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 3, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(block_colors[3], pSrc_pixels[c], false);
				}
				else
				{
					uint32_t cur_selector = 0, c;
					for (c = 0; c < n; c++)
					{
						const uint32_t y = m_pSorted_luma[c];
						while ((y * 2) >= block_inten_midpoints[cur_selector])
							if (++cur_selector > 2)
								goto done2;
						const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
						m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
						total_error += color_distance(block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
					}
				done2:
					while (c < n)
					{
						const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
						m_temp_selectors[sorted_pixel_index] = 3;
						total_error += color_distance(block_colors[3], pSrc_pixels[sorted_pixel_index], false);
						++c;
					}
				}
			}

			if (total_error < trial_solution.m_error)
			{
				trial_solution.m_error = total_error;
				trial_solution.m_coords.m_inten_table = inten_table;
				trial_solution.m_selectors.swap(m_temp_selectors);
				trial_solution.m_valid = true;
				if (!total_error)
					break;
			}
		}
		trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
		trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
		printf("Eval done: %u error: %I64u best error so far: %I64u\n", (trial_solution.m_error < pBest_solution->m_error), trial_solution.m_error, pBest_solution->m_error);
#endif

		bool success = false;
		if (pBest_solution)
		{
			if (trial_solution.m_error < pBest_solution->m_error)
			{
				*pBest_solution = trial_solution;
				success = true;
			}
		}

		return success;
	}